

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Instr * __thiscall GlobOpt::TrackMarkTempObject(GlobOpt *this,Instr *instrStart,Instr *instrLast)

{
  Instr *pIVar1;
  BasicBlock *pBVar2;
  RegOpnd *opnd;
  code *pcVar3;
  Instr *pIVar4;
  bool bVar5;
  OpndKind OVar6;
  undefined4 *puVar7;
  
  if (this->func->hasMarkTempObjects == true) {
    pIVar1 = instrLast->m_next;
    pBVar2 = this->currentBlock;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar4 = instrStart;
    do {
      instrLast = pIVar4;
      if (this->prePassLoop == (Loop *)0x0) {
        bVar5 = IR::Instr::HasAnyImplicitCalls(instrLast);
        if ((!bVar5) ||
           ((pBVar2->globOptData).maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0)
           ) goto LAB_0044bbe1;
        bVar5 = true;
        if (instrLast->m_src1 != (Opnd *)0x0) {
          instrLast = GenerateBailOutMarkTempObjectIfNeeded(this,instrLast,instrLast->m_src1,false);
          if (instrLast->m_src2 != (Opnd *)0x0) {
            instrLast = GenerateBailOutMarkTempObjectIfNeeded
                                  (this,instrLast,instrLast->m_src2,false);
          }
        }
      }
      else {
LAB_0044bbe1:
        bVar5 = false;
      }
      opnd = (RegOpnd *)instrLast->m_dst;
      if (opnd != (RegOpnd *)0x0) {
        OVar6 = IR::Opnd::GetKind((Opnd *)opnd);
        if (OVar6 == OpndKindReg) {
          OVar6 = IR::Opnd::GetKind((Opnd *)opnd);
          if (OVar6 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar5) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar7 = 0;
          }
          TrackTempObjectSyms(this,instrLast,opnd);
        }
        else if (bVar5) {
          instrLast = GenerateBailOutMarkTempObjectIfNeeded(this,instrLast,(Opnd *)opnd,true);
        }
      }
      pIVar4 = instrLast->m_next;
    } while (instrLast->m_next != pIVar1);
  }
  return instrLast;
}

Assistant:

IR::Instr *
GlobOpt::TrackMarkTempObject(IR::Instr * instrStart, IR::Instr * instrLast)
{
    if (!this->func->GetHasMarkTempObjects())
    {
        return instrLast;
    }
    IR::Instr * instr = instrStart;
    IR::Instr * instrEnd = instrLast->m_next;
    IR::Instr * lastInstr = nullptr;
    GlobOptBlockData& globOptData = *CurrentBlockData();
    do
    {
        bool mayNeedBailOnImplicitCallsPreOp = !this->IsLoopPrePass()
            && instr->HasAnyImplicitCalls()
            && globOptData.maybeTempObjectSyms != nullptr;
        if (mayNeedBailOnImplicitCallsPreOp)
        {
            IR::Opnd * src1 = instr->GetSrc1();
            if (src1)
            {
                instr = GenerateBailOutMarkTempObjectIfNeeded(instr, src1, false);
                IR::Opnd * src2 = instr->GetSrc2();
                if (src2)
                {
                    instr = GenerateBailOutMarkTempObjectIfNeeded(instr, src2, false);
                }
            }
        }

        IR::Opnd *dst = instr->GetDst();
        if (dst)
        {
            if (dst->IsRegOpnd())
            {
                TrackTempObjectSyms(instr, dst->AsRegOpnd());
            }
            else if (mayNeedBailOnImplicitCallsPreOp)
            {
                instr = GenerateBailOutMarkTempObjectIfNeeded(instr, dst, true);
            }
        }

        lastInstr = instr;
        instr = instr->m_next;
    }
    while (instr != instrEnd);
    return lastInstr;
}